

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<char_const(&)[66],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[3]>
                   (string *__return_storage_ptr__,char (*a) [66],
                   basic_string_view<char,_std::char_traits<char>_> *b,char (*args) [3])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_138;
  undefined8 local_100;
  undefined8 local_f8;
  cmAlphaNum local_f0;
  cmAlphaNum local_b8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_80;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_68;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_50;
  iterator local_38;
  undefined8 local_30;
  char (*local_28) [3];
  char (*args_local) [3];
  basic_string_view<char,_std::char_traits<char>_> *b_local;
  char (*a_local) [66];
  
  local_28 = args;
  args_local = (char (*) [3])b;
  b_local = (basic_string_view<char,_std::char_traits<char>_> *)a;
  a_local = (char (*) [66])__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_b8,*a);
  cmStrCat<char_const(&)[66],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[3]>(char_const(&)[66],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[3])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&local_80,
             &cmStrCat<char_const(&)[66],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[3]>(char_const&[],std::basic_string_view<char,std::char_traits<char>>&,char_const&[])
              ::makePair,&local_b8);
  local_100 = *(undefined8 *)args_local;
  local_f8 = *(undefined8 *)(args_local[2] + 2);
  cmAlphaNum::cmAlphaNum(&local_f0,*(string_view *)args_local);
  cmStrCat<char_const(&)[66],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[3]>(char_const(&)[66],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[3])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_68,
             &cmStrCat<char_const(&)[66],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[3]>(char_const&[],std::basic_string_view<char,std::char_traits<char>>&,char_const&[])
              ::makePair,&local_f0);
  cmAlphaNum::cmAlphaNum(&local_138,*local_28);
  cmStrCat<char_const(&)[66],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[3]>(char_const(&)[66],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[3])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_50,
             &cmStrCat<char_const(&)[66],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[3]>(char_const&[],std::basic_string_view<char,std::char_traits<char>>&,char_const&[])
              ::makePair,&local_138);
  local_38 = &local_80;
  local_30 = 3;
  views._M_len = 3;
  views._M_array = local_38;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}